

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.cpp
# Opt level: O2

void * HokuyoThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  __time_t _Var4;
  __suseconds_t _Var5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  size_type sVar9;
  ulong uVar10;
  long lVar11;
  int local_8850;
  int local_884c;
  timeval local_8848;
  long local_8830;
  long local_8828;
  double local_8820;
  interval local_8818;
  CHRONO chrono_period;
  char szTemp [256];
  HOKUYO hokuyo;
  char szSaveFilePath [256];
  double distances [2048];
  double angles [2048];
  
  memset(&hokuyo,0,0x578);
  StartChrono(&chrono_period);
  local_8850 = 100;
  bVar2 = false;
  local_884c = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      if (bPauseHokuyo == 0) break;
      if (!bVar2) {
        puts("Hokuyo paused.");
        DisconnectHokuyo(&hokuyo);
      }
      if (bExit != 0) goto LAB_0018a516;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartHokuyo == 0) {
      if (bVar2) goto LAB_0018a05a;
      iVar6 = GetLatestDataHokuyo(&hokuyo,distances,angles);
      if (iVar6 != 0) {
        puts("Connection to a Hokuyo lost.");
        DisconnectHokuyo(&hokuyo);
        lVar11 = (long)local_8850;
        goto LAB_0018a072;
      }
      iVar6 = gettimeofday(&local_8848,(__timezone_ptr_t)0x0);
      if (iVar6 != 0) {
        local_8848.tv_sec = 0;
        local_8848.tv_usec = 0;
      }
      _Var5 = local_8848.tv_usec;
      _Var4 = local_8848.tv_sec;
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      local_8820 = (double)_Var5 * 1e-06 + (double)_Var4;
      local_8830 = _Var4;
      local_8828 = _Var5;
      for (lVar11 = 0; lVar11 < hokuyo.StepCount; lVar11 = lVar11 + 1) {
        alpha_mes_hokuyo = angles[lVar11];
        d_mes_hokuyo = distances[lVar11];
        if (d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
            super__Vector_impl_data._M_start) {
          d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
          super__Vector_impl_data._M_finish =
               d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        interval::interval(&local_8818,&d_mes_hokuyo);
        std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
                  (&d_all_mes_hokuyo,(vector<interval,_std::allocator<interval>_> *)&local_8818);
        std::deque<double,_std::allocator<double>_>::push_back
                  (&alpha_mes_hokuyo_vector,&alpha_mes_hokuyo);
        std::deque<double,_std::allocator<double>_>::push_back(&d_mes_hokuyo_vector,&d_mes_hokuyo);
        std::
        deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ::push_back(&d_all_mes_hokuyo_vector,&d_all_mes_hokuyo);
        local_8818.inf = local_8820;
        std::deque<double,_std::allocator<double>_>::emplace_back<double>
                  (&t_hokuyo_history_vector,&local_8818.inf);
        std::deque<interval,_std::allocator<interval>_>::push_back
                  (&xhat_hokuyo_history_vector,(value_type *)&xhat);
        std::deque<interval,_std::allocator<interval>_>::push_back
                  (&yhat_hokuyo_history_vector,(value_type *)&yhat);
        std::deque<interval,_std::allocator<interval>_>::push_back
                  (&psihat_hokuyo_history_vector,(value_type *)&psihat);
        std::deque<interval,_std::allocator<interval>_>::push_back
                  (&vrxhat_hokuyo_history_vector,(value_type *)&vrxhat);
        sVar9 = std::deque<double,_std::allocator<double>_>::size(&alpha_mes_hokuyo_vector);
        if (hokuyo.StepCount < (int)sVar9) {
          std::deque<double,_std::allocator<double>_>::pop_front(&alpha_mes_hokuyo_vector);
          std::deque<double,_std::allocator<double>_>::pop_front(&d_mes_hokuyo_vector);
          std::
          deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
          ::pop_front(&d_all_mes_hokuyo_vector);
          std::deque<double,_std::allocator<double>_>::pop_front(&t_hokuyo_history_vector);
          std::deque<interval,_std::allocator<interval>_>::pop_front(&xhat_hokuyo_history_vector);
          std::deque<interval,_std::allocator<interval>_>::pop_front(&yhat_hokuyo_history_vector);
          std::deque<interval,_std::allocator<interval>_>::pop_front(&psihat_hokuyo_history_vector);
          std::deque<interval,_std::allocator<interval>_>::pop_front(&vrxhat_hokuyo_history_vector);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      if (hokuyo.bSaveRawData != 0) {
        fprintf((FILE *)hokuyo.pfSaveFile,"%d;%d;",local_8830,local_8828);
        for (lVar11 = 0; lVar11 < hokuyo.StepCount; lVar11 = lVar11 + 1) {
          fprintf((FILE *)hokuyo.pfSaveFile,"%.3f;%.3f;",SUB84(angles[lVar11],0),distances[lVar11]);
        }
        fputc(10,(FILE *)hokuyo.pfSaveFile);
        goto LAB_0018a254;
      }
      bVar3 = false;
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a Hokuyo.");
        DisconnectHokuyo(&hokuyo);
      }
      bRestartHokuyo = 0;
LAB_0018a05a:
      iVar6 = ConnectHokuyo(&hokuyo,"Hokuyo0.txt");
      lVar11 = 1000;
      if (iVar6 == 0) {
        local_8850 = hokuyo.threadperiod;
        local_8848.tv_sec = 0;
        local_8848.tv_usec = 0;
        memset(angles,0,0x4000);
        memset(distances,0,0x4000);
        if (hokuyo.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)hokuyo.pfSaveFile);
          hokuyo.pfSaveFile = (FILE *)0x0;
        }
        if (hokuyo.bSaveRawData != 0) {
          if (hokuyo.szCfgFilePath[0] == '\0') {
            builtin_strncpy(szTemp,"hokuyo",7);
          }
          else {
            sprintf(szTemp,"%.127s",hokuyo.szCfgFilePath);
          }
          sVar7 = strlen(szTemp);
          iVar6 = (int)sVar7 + 1;
          uVar10 = sVar7 & 0xffffffff;
          do {
            if ((int)uVar10 < 1) goto LAB_0018a1dc;
            uVar1 = uVar10 - 1;
            iVar6 = iVar6 + -1;
            lVar11 = uVar10 - 1;
            uVar10 = uVar1;
          } while (szTemp[lVar11] != '.');
          if ((uVar1 != 0) && (iVar6 <= (int)sVar7)) {
            memset(szTemp + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
          }
LAB_0018a1dc:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar8 = strtimeex_fns();
          sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar8);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          hokuyo.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
          if ((FILE *)hokuyo.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create Hokuyo data file.");
            bVar3 = false;
            break;
          }
          fwrite("tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);...\n",0x3e,1,
                 (FILE *)hokuyo.pfSaveFile);
LAB_0018a254:
          fflush((FILE *)hokuyo.pfSaveFile);
        }
        bVar3 = false;
        bVar2 = true;
      }
      else {
LAB_0018a072:
        mSleep(lVar11);
        local_884c = local_884c + 1;
        if (ExitOnErrorCount <= local_884c && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_0018a516:
          bVar3 = true;
          break;
        }
        bVar2 = false;
        bVar3 = true;
      }
    }
  } while (bExit == 0);
  StopChronoQuick(&chrono_period);
  if (hokuyo.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)hokuyo.pfSaveFile);
    hokuyo.pfSaveFile = (FILE *)0x0;
  }
  if (!bVar3) {
    DisconnectHokuyo(&hokuyo);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO hokuyo;
	//HOKUYODATA hokuyodata;
	struct timeval tv;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&hokuyo, 0, sizeof(HOKUYO));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseHokuyo) 
		{
			if (bConnected)
			{
				printf("Hokuyo paused.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartHokuyo) 
		{
			if (bConnected)
			{
				printf("Restarting a Hokuyo.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
			}
			bRestartHokuyo = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectHokuyo(&hokuyo, "Hokuyo0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = hokuyo.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));

				if (hokuyo.pfSaveFile != NULL)
				{
					fclose(hokuyo.pfSaveFile); 
					hokuyo.pfSaveFile = NULL;
				}
				if ((hokuyo.bSaveRawData)&&(hokuyo.pfSaveFile == NULL)) 
				{
					if (strlen(hokuyo.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", hokuyo.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "hokuyo");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					hokuyo.pfSaveFile = fopen(szSaveFilePath, "w");
					if (hokuyo.pfSaveFile == NULL) 
					{
						printf("Unable to create Hokuyo data file.\n");
						break;
					}
					fprintf(hokuyo.pfSaveFile, 
						"tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);...\n"
						); 
					fflush(hokuyo.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataHokuyo(&hokuyo, distances, angles) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				for (i = 0; i < hokuyo.StepCount; i++)
				{
					alpha_mes_hokuyo = angles[i];
					d_mes_hokuyo = distances[i];

					// For compatibility with a Seanet...
					d_all_mes_hokuyo.clear();
					d_all_mes_hokuyo.push_back(d_mes_hokuyo);

					alpha_mes_hokuyo_vector.push_back(alpha_mes_hokuyo);
					d_mes_hokuyo_vector.push_back(d_mes_hokuyo);
					d_all_mes_hokuyo_vector.push_back(d_all_mes_hokuyo);
					t_hokuyo_history_vector.push_back(tv.tv_sec+0.000001*tv.tv_usec);
					xhat_hokuyo_history_vector.push_back(xhat);
					yhat_hokuyo_history_vector.push_back(yhat);
					psihat_hokuyo_history_vector.push_back(psihat);
					vrxhat_hokuyo_history_vector.push_back(vrxhat);

					if ((int)alpha_mes_hokuyo_vector.size() > hokuyo.StepCount)
					{
						alpha_mes_hokuyo_vector.pop_front();
						d_mes_hokuyo_vector.pop_front();
						d_all_mes_hokuyo_vector.pop_front();
						t_hokuyo_history_vector.pop_front();
						xhat_hokuyo_history_vector.pop_front();
						yhat_hokuyo_history_vector.pop_front();
						psihat_hokuyo_history_vector.pop_front();
						vrxhat_hokuyo_history_vector.pop_front();
					}
				}

				LeaveCriticalSection(&StateVariablesCS);

				if (hokuyo.bSaveRawData)
				{
					//for (i = 0; i < hokuyo.StepCount; i++)
					//{
					//	fprintf(hokuyo.pfSaveFile, "%d;%d;%.3f;%.3f;\n", (int)tv.tv_sec, (int)tv.tv_usec, angles[i], distances[i]);
					//}
					fprintf(hokuyo.pfSaveFile, "%d;%d;", (int)tv.tv_sec, (int)tv.tv_usec);
					for (i = 0; i < hokuyo.StepCount; i++)
					{
						fprintf(hokuyo.pfSaveFile, "%.3f;%.3f;", angles[i], distances[i]);
					}
					fprintf(hokuyo.pfSaveFile, "\n");
					fflush(hokuyo.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a Hokuyo lost.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
				mSleep(threadperiod);
			}
		}

		//printf("HokuyoThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (hokuyo.pfSaveFile != NULL)
	{
		fclose(hokuyo.pfSaveFile); 
		hokuyo.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectHokuyo(&hokuyo);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}